

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

void djb::fresnel::f0_to_ior(value_type *f0,value_type *ior)

{
  float_t f0_00;
  size_t sVar1;
  float *pfVar2;
  int local_1c;
  int i;
  value_type *ior_local;
  value_type *f0_local;
  
  if (ior == (value_type *)0x0) {
    __assert_fail("ior && \"Null output ptr\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                  ,0x460,
                  "void djb::fresnel::f0_to_ior(const brdf::value_type &, brdf::value_type *)");
  }
  for (local_1c = 0; sVar1 = std::valarray<float>::size(f0), local_1c < (int)sVar1;
      local_1c = local_1c + 1) {
    pfVar2 = std::valarray<float>::operator[](f0,(long)local_1c);
    f0_00 = *pfVar2;
    pfVar2 = std::valarray<float>::operator[](ior,(long)local_1c);
    f0_to_ior(f0_00,pfVar2);
  }
  return;
}

Assistant:

void f0_to_ior(const brdf::value_type& f0, brdf::value_type *ior)
{
	DJB_ASSERT(ior && "Null output ptr");
	for (int i = 0; i < (int)f0.size(); ++i)
		f0_to_ior(f0[i], &(*ior)[i]);
}